

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.cpp
# Opt level: O1

void __thiscall FIX::DataDictionary::readFromURL(DataDictionary *this,string *url)

{
  char cVar1;
  tuple<FIX::DOMDocument_*,_std::default_delete<FIX::DOMDocument>_> this_00;
  ConfigError *this_01;
  pointer *__ptr;
  DOMDocumentPtr pDoc;
  __uniq_ptr_impl<FIX::DOMDocument,_std::default_delete<FIX::DOMDocument>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60 [2];
  
  this_00.super__Tuple_impl<0UL,_FIX::DOMDocument_*,_std::default_delete<FIX::DOMDocument>_>.
  super__Head_base<0UL,_FIX::DOMDocument_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_FIX::DOMDocument_*,_std::default_delete<FIX::DOMDocument>_>)
       operator_new(0xd8);
  PUGIXML_DOMDocument::PUGIXML_DOMDocument
            ((PUGIXML_DOMDocument *)
             this_00.
             super__Tuple_impl<0UL,_FIX::DOMDocument_*,_std::default_delete<FIX::DOMDocument>_>.
             super__Head_base<0UL,_FIX::DOMDocument_*,_false>._M_head_impl);
  local_68._M_t.super__Tuple_impl<0UL,_FIX::DOMDocument_*,_std::default_delete<FIX::DOMDocument>_>.
  super__Head_base<0UL,_FIX::DOMDocument_*,_false>._M_head_impl =
       (tuple<FIX::DOMDocument_*,_std::default_delete<FIX::DOMDocument>_>)
       (tuple<FIX::DOMDocument_*,_std::default_delete<FIX::DOMDocument>_>)
       this_00.super__Tuple_impl<0UL,_FIX::DOMDocument_*,_std::default_delete<FIX::DOMDocument>_>.
       super__Head_base<0UL,_FIX::DOMDocument_*,_false>._M_head_impl;
  cVar1 = (**(code **)(*(long *)this_00.
                                super__Tuple_impl<0UL,_FIX::DOMDocument_*,_std::default_delete<FIX::DOMDocument>_>
                                .super__Head_base<0UL,_FIX::DOMDocument_*,_false>._M_head_impl +
                      0x18))(this_00.
                             super__Tuple_impl<0UL,_FIX::DOMDocument_*,_std::default_delete<FIX::DOMDocument>_>
                             .super__Head_base<0UL,_FIX::DOMDocument_*,_false>._M_head_impl,url);
  if (cVar1 != '\0') {
    readFromDocument(this,(DOMDocumentPtr *)&local_68);
    (**(code **)(*(long *)this_00.
                          super__Tuple_impl<0UL,_FIX::DOMDocument_*,_std::default_delete<FIX::DOMDocument>_>
                          .super__Head_base<0UL,_FIX::DOMDocument_*,_false>._M_head_impl + 8))
              (this_00.
               super__Tuple_impl<0UL,_FIX::DOMDocument_*,_std::default_delete<FIX::DOMDocument>_>.
               super__Head_base<0UL,_FIX::DOMDocument_*,_false>._M_head_impl);
    return;
  }
  this_01 = (ConfigError *)__cxa_allocate_exception(0x50);
  std::operator+(local_60,url,": Could not parse data dictionary file");
  ConfigError::ConfigError(this_01,local_60);
  __cxa_throw(this_01,&ConfigError::typeinfo,FIX::Exception::~Exception);
}

Assistant:

EXCEPT(ConfigError) {
  DOMDocumentPtr pDoc(new PUGIXML_DOMDocument());

  if (!pDoc->load(url)) {
    throw ConfigError(url + ": Could not parse data dictionary file");
  }

  try {
    readFromDocument(pDoc);
  } catch (ConfigError &e) {
    throw ConfigError(url + ": " + e.what());
  }
}